

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socksd.c
# Opt level: O0

void loghex(uchar *buffer,ssize_t len)

{
  int local_4ec;
  long lStack_4e8;
  int left;
  ssize_t width;
  char *optr;
  uchar *ptr;
  ssize_t i;
  char data [1200];
  ssize_t len_local;
  uchar *buffer_local;
  
  width = (ssize_t)&i;
  lStack_4e8 = 0;
  local_4ec = 0x4b0;
  data._1192_8_ = len;
  for (ptr = (uchar *)0x0; (long)ptr < (long)data._1192_8_ && -1 < local_4ec; ptr = ptr + 1) {
    curl_msnprintf((char *)width,(long)local_4ec,"%02x",(ulong)buffer[(long)ptr]);
    lStack_4e8 = lStack_4e8 + 2;
    width = width + 2;
    local_4ec = local_4ec + -2;
  }
  if (lStack_4e8 != 0) {
    logmsg("\'%s\'",&i);
  }
  return;
}

Assistant:

static void loghex(unsigned char *buffer, ssize_t len)
{
  char data[1200];
  ssize_t i;
  unsigned char *ptr = buffer;
  char *optr = data;
  ssize_t width = 0;
  int left = sizeof(data);

  for(i = 0; i<len && (left >= 0); i++) {
    msnprintf(optr, left, "%02x", ptr[i]);
    width += 2;
    optr += 2;
    left -= 2;
  }
  if(width)
    logmsg("'%s'", data);
}